

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

token * declaration_list(dmr_C *C,token *token,symbol_list **list)

{
  ctype *pcVar1;
  ulong uVar2;
  position pos;
  ident *ident;
  symbol *psVar3;
  ulong uVar4;
  undefined1 auVar5 [8];
  unsigned_long uVar6;
  unsigned_long uVar7;
  context_list *pcVar8;
  undefined8 uVar9;
  undefined8 sym;
  int iVar10;
  token *ptVar11;
  symbol *ptr;
  symbol *psVar12;
  ulong uVar13;
  char *pcVar14;
  bool bVar15;
  bool bVar16;
  ctype saved;
  undefined1 auStack_a8 [8];
  decl_state ctx;
  expression *local_48;
  expression *expr;
  symbol_list **local_38;
  
  ctx.ident = (ident **)0x0;
  ctx.mode = (symbol_op *)0x0;
  ctx.ctype.as = 0;
  ctx.ctype._28_4_ = 0;
  ctx.ctype.base_type = (symbol *)0x0;
  ctx.ctype.alignment = 0;
  ctx.ctype.contexts = (context_list *)0x0;
  auStack_a8 = (undefined1  [8])0x0;
  ctx.ctype.modifiers = 0;
  ptVar11 = declaration_specifiers(C,token,(decl_state *)auStack_a8);
  uVar9 = ctx.ctype._24_8_;
  pcVar8 = ctx.ctype.contexts;
  uVar7 = ctx.ctype.alignment;
  uVar6 = ctx.ctype.modifiers;
  auVar5 = auStack_a8;
  bVar15 = ctx.mode._1_1_ != '\0';
  uVar2 = *(ulong *)(storage_modifiers_mod + ((ulong)ctx.mode >> 0x10 & 0xff) * 8);
  bVar16 = ctx.mode._3_1_ != '\0';
  local_38 = list;
  while( true ) {
    auStack_a8 = auVar5;
    ctx.ctype.modifiers = uVar6;
    ctx.ctype.alignment = uVar7;
    ctx.ctype.contexts = pcVar8;
    ctx.ctype._24_8_ = uVar9;
    ptr = dmrC_alloc_symbol(C->S,ptVar11->pos,3);
    ctx.ctype.base_type = (symbol *)&ptr->ident;
    ptVar11 = declarator(C,ptVar11,(decl_state *)auStack_a8);
    sym = ctx.ctype._24_8_;
    pos = ptVar11->pos;
    if (((pos._0_4_ & 0x3f) == 0x11) && ((ptVar11->field_2).special == 0x3a)) {
      if (((symbol *)ctx.ctype._24_8_ == &C->S->int_type) ||
         (iVar10 = dmrC_is_int_type(C->S,(symbol *)ctx.ctype._24_8_), iVar10 != 0)) {
        psVar12 = alloc_indirect_symbol(C,pos,(ctype *)auStack_a8,0xd);
        ptVar11 = dmrC_conditional_expression(C,ptVar11->next,&local_48);
        uVar13 = dmrC_const_expression_value(C,local_48);
        list = local_38;
        (psVar12->field_14).field_1.normal = (int)uVar13;
        expr = (expression *)psVar12;
        if ((uVar13 & 0xffffffff80000000) == 0) {
          ident = *(ident **)ctx.ctype.base_type;
          if (uVar13 == 0 && ident != (ident *)0x0) {
            pcVar14 = dmrC_show_ident(C,ident);
            dmrC_sparse_error(C,ptVar11->pos,"invalid named zero-width bitfield `%s\'",pcVar14);
            uVar13 = 0xffffffffffffffff;
          }
          else if (ident != (ident *)0x0) {
            psVar3 = (psVar12->field_14).field_2.ctype.base_type;
            if (psVar3 != &C->S->int_type) {
              psVar12 = psVar3;
            }
            uVar4 = (psVar12->field_14).field_2.ctype.modifiers;
            if (((uVar13 == 1) && (C->Wone_bit_signed_bitfield != 0)) && ((uVar4 & 0x80) == 0)) {
              dmrC_sparse_error(C,ptVar11->pos,"dubious one-bit signed bitfield");
            }
            list = local_38;
            if (((C->Wdefault_bitfield_sign != 0) && (*(char *)psVar12 != '\t')) &&
               (((psVar12->field_14).field_2.ctype.modifiers & 0x40000000) == 0 &&
                (uVar4 & 0x80) == 0)) {
              dmrC_warning(C,ptVar11->pos,
                           "dubious bitfield without explicit `signed\' or `unsigned\'");
              list = local_38;
            }
          }
        }
        else {
          dmrC_sparse_error(C,ptVar11->pos,"invalid bitfield width, %lld.",uVar13);
          uVar13 = 0xffffffffffffffff;
          list = local_38;
        }
        *(int *)&expr[1].ctype = (int)uVar13;
        *(position *)&(expr->pos).field_0x4 = ptVar11->pos;
      }
      else {
        pcVar14 = dmrC_show_typename(C,(symbol *)sym);
        dmrC_sparse_error(C,ptVar11->pos,"invalid bitfield specifier for type %s.",pcVar14);
        ptVar11 = dmrC_conditional_expression(C,ptVar11->next,&local_48);
        list = local_38;
      }
    }
    ptVar11 = handle_attributes(C,ptVar11,(decl_state *)auStack_a8,8);
    apply_modifiers(C,ptVar11->pos,(decl_state *)auStack_a8);
    (ptr->field_14).field_2.ctype.modifiers = (unsigned_long)auStack_a8;
    (ptr->field_14).field_2.ctype.alignment = ctx.ctype.modifiers;
    pcVar1 = &(ptr->field_14).field_2.ctype;
    pcVar1->modifiers = pcVar1->modifiers | (ulong)bVar16 << 0x11 | (ulong)bVar15 << 0x12 | uVar2;
    (ptr->field_14).field_2.ctype.base_type = (symbol *)ctx.ctype._24_8_;
    (ptr->field_14).field_2.ctype.contexts = (context_list *)ctx.ctype.alignment;
    *(context_list **)&(ptr->field_14).field_2.ctype.as = ctx.ctype.contexts;
    ptr->endpos = ptVar11->pos;
    ptrlist_add((ptr_list **)list,ptr,&C->ptrlist_allocator);
    if ((((ulong)ptVar11->pos & 0x3f) != 0x11) || ((ptVar11->field_2).special != 0x2c)) break;
    ptVar11 = ptVar11->next;
  }
  return ptVar11;
}

Assistant:

static struct token *declaration_list(struct dmr_C *C, struct token *token, struct symbol_list **list)
{
	struct decl_state ctx = {.prefer_abstract = 0};
	struct ctype saved;
	unsigned long mod;

	token = declaration_specifiers(C, token, &ctx);
	mod = storage_modifiers(C, &ctx);
	saved = ctx.ctype;
	for (;;) {
		struct symbol *decl = dmrC_alloc_symbol(C->S, token->pos, SYM_NODE);
		ctx.ident = &decl->ident;

		token = declarator(C, token, &ctx);
		if (dmrC_match_op(token, ':'))
			token = handle_bitfield(C, token, &ctx);

		token = handle_attributes(C, token, &ctx, KW_ATTRIBUTE);
		apply_modifiers(C, token->pos, &ctx);

		decl->ctype = ctx.ctype;
		decl->ctype.modifiers |= mod;
		decl->endpos = token->pos;
		dmrC_add_symbol(C, list, decl);
		if (!dmrC_match_op(token, ','))
			break;
		token = token->next;
		ctx.ctype = saved;
	}
	return token;
}